

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O1

void __thiscall cornelich::excerpt_appender::finish(excerpt_appender *this)

{
  atomic_int_fast64_t *paVar1;
  element_type *peVar2;
  void *pvVar3;
  region *prVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long lVar8;
  logic_error *this_00;
  uint8_t *index_value;
  bool bVar9;
  pair<std::shared_ptr<cornelich::region>,_long> local_38;
  
  if (this->m_finished == true) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Not started");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar2 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    pvVar3 = (peVar2->m_region).m_base;
    *(int32_t *)((long)pvVar3 + (long)((*(int *)&(this->m_buffer).m_data - (int)pvVar3) + -4)) =
         ~(this->m_buffer).m_position;
    peVar2 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    prVar4 = (this->m_index_region).
             super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    index_value = (this->m_buffer).m_data +
                  ((long)this->m_last_thread_id <<
                  (-(char)(this->m_chronicle->m_settings).m_thread_id_bits & 0x3fU)) +
                  ((long)peVar2->m_index * (this->m_chronicle->m_settings).m_data_block_size -
                  (long)(peVar2->m_region).m_base);
    if (prVar4 == (region *)0x0) {
      lVar8 = -1;
    }
    else {
      lVar8 = vanilla_index::append(prVar4,(int64_t)index_value);
    }
    if (lVar8 < 0) {
      peVar2 = (this->m_index_region).
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        this->m_last_index_file_number = peVar2->m_index + 1;
        (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        p_Var5 = (this->m_index_region).
                 super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
      }
      vanilla_index::append
                (&local_38,&this->m_chronicle->m_index,this->m_last_cycle,(int64_t)index_value,
                 this->m_last_index_file_number);
      _Var7._M_pi = local_38.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar2 = local_38.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_38.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_38.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var5 = (this->m_index_region).
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var7._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (local_38.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this->m_last_index_file_number =
           ((this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->m_index;
      lVar8 = local_38.second;
    }
    lVar8 = (lVar8 >> 3) +
            ((long)this->m_last_cycle << ((byte)this->m_chronicle->m_entries_for_cycle_bits & 0x3f))
            + ((long)((this->m_index_region).
                      super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_index << ((byte)this->m_chronicle->m_index_block_longs_bits & 0x3f));
    this->m_last_written_index = lVar8;
    do {
      lVar6 = (this->m_chronicle->m_last_written_index).super___atomic_base<long>._M_i;
      if (lVar8 <= lVar6) break;
      paVar1 = &this->m_chronicle->m_last_written_index;
      LOCK();
      bVar9 = lVar6 == (paVar1->super___atomic_base<long>)._M_i;
      if (bVar9) {
        (paVar1->super___atomic_base<long>)._M_i = lVar8;
      }
      UNLOCK();
    } while (!bVar9);
    prVar4 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    this->m_index = this->m_last_written_index + 1;
    region::position(prVar4,((prVar4->m_position_offset).super___atomic_base<int>._M_i -
                            prVar4->m_start_offset) + (this->m_buffer).m_position + 4);
    region::align_position
              ((this->m_data_region).
               super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr,4);
    this->m_finished = true;
  }
  return;
}

Assistant:

void excerpt_appender::finish()
{
    if(m_finished)
        throw std::logic_error("Not started");

    if(!m_data_region)
        return;

    const auto length = ~static_cast<std::int32_t>(m_buffer.position());

    m_data_region->write_ordered32(static_cast<std::int32_t>(m_buffer.data() - m_data_region->data() - 4), length);

    const auto data_offset = m_data_region->index() * m_chronicle.m_settings.data_block_size() + (m_buffer.data() - m_data_region->data());
    const auto index_value = (static_cast<std::int64_t>(m_last_thread_id) << m_chronicle.m_settings.index_data_offset_bits()) + data_offset;

    auto position = m_index_region ? vanilla_index::append(*m_index_region, index_value) : -1;
    if (position < 0)
    {
        if (m_index_region)
        {
            m_last_index_file_number = static_cast<std::int32_t>(m_index_region->index()) + 1;
            m_index_region.reset();
        }

        std::tie(m_index_region, position) = m_chronicle.m_index.append(m_last_cycle, index_value, m_last_index_file_number);
        m_last_index_file_number = m_index_region->index();
    }

    set_last_written_index(m_last_cycle, m_index_region->index(), position);

    m_index = m_last_written_index + 1;
    m_data_region->position(m_data_region->position() + m_buffer.position() + 4);
    m_data_region->align_position(4);
    m_finished = true;
}